

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void flush_pending(z_streamp_conflict strm)

{
  uInt *puVar1;
  uint uVar2;
  internal_state_conflict1 *piVar3;
  uint uVar4;
  ulong __n;
  
  uVar2 = strm->state->pending;
  uVar4 = strm->avail_out;
  if (uVar2 < strm->avail_out) {
    uVar4 = uVar2;
  }
  if (uVar4 != 0) {
    __n = (ulong)uVar4;
    memcpy(strm->next_out,strm->state->pending_out,__n);
    strm->next_out = strm->next_out + __n;
    piVar3 = strm->state;
    piVar3->pending_out = piVar3->pending_out + __n;
    strm->total_out = strm->total_out + __n;
    strm->avail_out = strm->avail_out - uVar4;
    puVar1 = &piVar3->pending;
    *puVar1 = *puVar1 - uVar4;
    if (*puVar1 == 0) {
      piVar3->pending_out = piVar3->pending_buf;
    }
  }
  return;
}

Assistant:

local void flush_pending(strm)
    z_streamp strm;
{
    unsigned len = strm->state->pending;

    if (len > strm->avail_out) len = strm->avail_out;
    if (len == 0) return;

    zmemcpy(strm->next_out, strm->state->pending_out, len);
    strm->next_out  += len;
    strm->state->pending_out  += len;
    strm->total_out += len;
    strm->avail_out  -= len;
    strm->state->pending -= len;
    if (strm->state->pending == 0) {
        strm->state->pending_out = strm->state->pending_buf;
    }
}